

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O3

OrderCancelReplaceRequest * __thiscall
Application::queryCancelReplaceRequest42
          (OrderCancelReplaceRequest *__return_storage_ptr__,Application *this)

{
  _func_int **pp_Var1;
  bool bVar2;
  Application *pAVar3;
  string *psVar4;
  string *psVar5;
  undefined1 local_290 [88];
  FieldBase local_238;
  FieldBase local_1e0;
  FieldBase local_188;
  FieldBase local_130;
  FieldBase local_d8;
  FieldBase local_80;
  
  pAVar3 = this;
  queryOrigClOrdID((OrigClOrdID *)local_290,this);
  queryClOrdID((ClOrdID *)&local_130,pAVar3);
  pAVar3 = (Application *)0x15;
  FIX::CharField::CharField((CharField *)&local_238,0x15,'1');
  local_238._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00152078;
  querySymbol((Symbol *)&local_188,pAVar3);
  querySide((Side *)&local_1e0,pAVar3);
  FIX::TransactTime::TransactTime((TransactTime *)&local_80);
  queryOrdType((OrdType *)&local_d8,pAVar3);
  FIX42::OrderCancelReplaceRequest::OrderCancelReplaceRequest
            (__return_storage_ptr__,(OrigClOrdID *)local_290,(ClOrdID *)&local_130,
             (HandlInst *)&local_238,(Symbol *)&local_188,(Side *)&local_1e0,
             (TransactTime *)&local_80,(OrdType *)&local_d8);
  FIX::FieldBase::~FieldBase(&local_d8);
  FIX::FieldBase::~FieldBase(&local_80);
  FIX::FieldBase::~FieldBase(&local_1e0);
  FIX::FieldBase::~FieldBase(&local_188);
  FIX::FieldBase::~FieldBase(&local_238);
  FIX::FieldBase::~FieldBase(&local_130);
  FIX::FieldBase::~FieldBase((FieldBase *)local_290);
  pp_Var1 = (_func_int **)(local_290 + 0x10);
  psVar5 = (string *)local_290;
  local_290._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>(psVar5,"New price","");
  psVar4 = (string *)local_290;
  bVar2 = queryConfirm((Application *)psVar5,psVar4);
  if ((_func_int **)local_290._0_8_ != pp_Var1) {
    psVar4 = (string *)(local_290._16_8_ + 1);
    operator_delete((void *)local_290._0_8_,(ulong)psVar4);
  }
  if (bVar2) {
    queryPrice((Price *)local_290,(Application *)psVar4);
    FIX::FieldMap::setField((FieldMap *)__return_storage_ptr__,(FieldBase *)local_290,true);
    FIX::FieldBase::~FieldBase((FieldBase *)local_290);
  }
  psVar5 = (string *)local_290;
  local_290._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>(psVar5,"New quantity","");
  psVar4 = (string *)local_290;
  bVar2 = queryConfirm((Application *)psVar5,psVar4);
  if ((_func_int **)local_290._0_8_ != pp_Var1) {
    psVar4 = (string *)(local_290._16_8_ + 1);
    operator_delete((void *)local_290._0_8_,(ulong)psVar4);
  }
  if (bVar2) {
    queryOrderQty((OrderQty *)local_290,(Application *)psVar4);
    FIX::FieldMap::setField((FieldMap *)__return_storage_ptr__,(FieldBase *)local_290,true);
    FIX::FieldBase::~FieldBase((FieldBase *)local_290);
  }
  queryHeader(this,(Header *)&(__return_storage_ptr__->super_Message).field_0x70);
  return __return_storage_ptr__;
}

Assistant:

FIX42::OrderCancelReplaceRequest Application::queryCancelReplaceRequest42() {
  FIX42::OrderCancelReplaceRequest cancelReplaceRequest(
      queryOrigClOrdID(),
      queryClOrdID(),
      FIX::HandlInst('1'),
      querySymbol(),
      querySide(),
      FIX::TransactTime(),
      queryOrdType());

  if (queryConfirm("New price")) {
    cancelReplaceRequest.set(queryPrice());
  }
  if (queryConfirm("New quantity")) {
    cancelReplaceRequest.set(queryOrderQty());
  }

  queryHeader(cancelReplaceRequest.getHeader());
  return cancelReplaceRequest;
}